

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O3

double __thiscall
imrt::IntensityILS::localSearch
          (IntensityILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  _List_node_base *p_Var1;
  int iVar2;
  int iVar3;
  double intensity;
  double dVar4;
  double dVar5;
  _List_node_base local_40;
  
  iVar2 = rand();
  iVar3 = *(int *)&(this->super_ILS).field_0x24;
  dVar4 = (double)iVar3;
  intensity = (double)((int)((double)(iVar2 % (int)((this->maxdelta - dVar4) + 1.0) + iVar3) / dVar4
                            ) * iVar3);
  dVar5 = this->maxdelta * this->alpha;
  if (dVar4 <= dVar5) {
    dVar4 = dVar5;
  }
  this->maxdelta = dVar4;
  if (target_beam.first != false) {
    intensity = -intensity;
  }
  dVar4 = this->maxratio;
  iVar3 = 0;
  if (0.5 < dVar4) {
    iVar3 = rand();
    dVar4 = this->maxratio;
    iVar3 = iVar3 % (int)(dVar4 + 0.5);
  }
  this->maxratio = dVar4 * this->beta;
  Station::increaseIntensity_repair_abi_cxx11_
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_40,
             target_beam.second.first,target_beam.second.second,intensity,iVar3);
  dVar4 = Plan::incremental_eval
                    (P,target_beam.second.first,
                     (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_40);
  while (local_40._M_next != &local_40) {
    p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
              &(local_40._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_40._M_next);
    local_40._M_next = p_Var1;
  }
  return dVar4;
}

Assistant:

double IntensityILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P){
		Station*s = target_beam.second.first; int beamlet=target_beam.second.second;
		bool sign=target_beam.first; //impact in F (+ or -)

		//double delta_intensity= rand()%3+1;

		double delta_intensity= rand()%int(maxdelta-step_intensity+1)+step_intensity; //random entre step_intensity y maxdelta
		delta_intensity = (int)  (delta_intensity/step_intensity) * step_intensity;

		maxdelta = maxdelta*alpha;
		if(maxdelta < step_intensity) maxdelta=step_intensity;

		if(sign) delta_intensity*=-1;

		double ratio= (maxratio>0.5)? rand()%int(maxratio + 0.5) : 0;
		maxratio = maxratio*beta;

		auto diff=s->increaseIntensity_repair(beamlet,delta_intensity,ratio);
		double eval=P.incremental_eval(*s,diff);
		//F.incremental_eval(*s,w,Zmin,Zmax, diff);

		return eval;
	}